

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O3

Matrix4d * math::view(Matrix4d *__return_storage_ptr__,Tuple4d *from,Tuple4d *to,Tuple4d *up)

{
  double dVar1;
  double dVar2;
  int i;
  long lVar3;
  double *pdVar4;
  long lVar5;
  int i_1;
  size_t sVar6;
  Matrix4d ret_2;
  Tuple4d true_up;
  Tuple4d left;
  Tuple4d forward;
  Matrix4d ret;
  Matrix4d local_208;
  Tuple4d local_188;
  Tuple4d local_168;
  Tuple4d local_148;
  Matrix4d local_128;
  Matrix4d local_a8;
  
  operator-(to,from);
  Tuple4d::normalize(&local_148,(Tuple4d *)&local_128);
  Tuple4d::normalize((Tuple4d *)&local_128,up);
  cross(&local_148,(Tuple4d *)&local_128);
  cross(&local_168,&local_148);
  local_128.m_buffer[3][2] = 0.0;
  local_128.m_buffer[3][3] = 0.0;
  local_128.m_buffer[3][0] = 0.0;
  local_128.m_buffer[3][1] = 0.0;
  local_128.m_buffer[2][2] = 0.0;
  local_128.m_buffer[2][3] = 0.0;
  local_128.m_buffer[2][0] = 0.0;
  local_128.m_buffer[2][1] = 0.0;
  local_128.m_buffer[1][2] = 0.0;
  local_128.m_buffer[1][3] = 0.0;
  local_128.m_buffer[1][0] = 0.0;
  local_128.m_buffer[1][1] = 0.0;
  local_128.m_buffer[0][2] = 0.0;
  local_128.m_buffer[0][3] = 0.0;
  local_128.m_buffer[0][0] = 0.0;
  local_128.m_buffer[0][1] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      if (lVar3 == lVar5) {
        *(undefined8 *)((long)local_128.m_buffer + lVar3 * 0x28) = 0x3ff0000000000000;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  sVar6 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_168,sVar6);
    local_128.m_buffer[0][sVar6] = *pdVar4;
    sVar6 = sVar6 + 1;
  } while (sVar6 != 3);
  sVar6 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_188,sVar6);
    local_128.m_buffer[1][sVar6] = *pdVar4;
    sVar6 = sVar6 + 1;
  } while (sVar6 != 3);
  sVar6 = 0;
  do {
    pdVar4 = Tuple4d::operator()(&local_148,sVar6);
    local_128.m_buffer[2][sVar6] = -*pdVar4;
    sVar6 = sVar6 + 1;
  } while (sVar6 != 3);
  local_208.m_buffer[3][2] = 0.0;
  local_208.m_buffer[3][3] = 0.0;
  local_208.m_buffer[3][0] = 0.0;
  local_208.m_buffer[3][1] = 0.0;
  local_208.m_buffer[2][2] = 0.0;
  local_208.m_buffer[2][3] = 0.0;
  local_208.m_buffer[2][0] = 0.0;
  local_208.m_buffer[2][1] = 0.0;
  local_208.m_buffer[1][2] = 0.0;
  local_208.m_buffer[1][3] = 0.0;
  local_208.m_buffer[1][0] = 0.0;
  local_208.m_buffer[1][1] = 0.0;
  local_208.m_buffer[0][2] = 0.0;
  local_208.m_buffer[0][3] = 0.0;
  local_208.m_buffer[0][0] = 0.0;
  local_208.m_buffer[0][1] = 0.0;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      if (lVar3 == lVar5) {
        *(undefined8 *)((long)local_208.m_buffer + lVar3 * 0x28) = 0x3ff0000000000000;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  pdVar4 = Tuple4d::operator()(from,0);
  dVar1 = *pdVar4;
  pdVar4 = Tuple4d::operator()(from,1);
  dVar2 = *pdVar4;
  pdVar4 = Tuple4d::operator()(from,2);
  Matrix4d::translate(&local_a8,&local_208,-dVar1,-dVar2,-*pdVar4);
  operator*(__return_storage_ptr__,&local_128,&local_a8);
  return __return_storage_ptr__;
}

Assistant:

math::Matrix4d math::view(const math::Tuple4d &from, const math::Tuple4d &to, const math::Tuple4d &up)
{
    math::Tuple4d forward = (to - from).normalize();
    math::Tuple4d left = cross(forward, up.normalize());
    math::Tuple4d true_up = cross(left, forward);

    math::Matrix4d ret{identity()};

    for (int i = 0; i < 3; i++)
    {
	ret(0, i) = left(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(1, i) = true_up(i);
    }

    for (int i = 0; i < 3; i++)
    {
	ret(2, i) = -forward(i);
    }

    return (ret * identity().translate(-from(0), -from(1), -from(2)));
}